

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual>::evaluate
          (RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *this,
          ExecValueAccess dst,ExecConstValueAccess a,ExecConstValueAccess b)

{
  bool bVar1;
  Type TVar2;
  int a_00;
  int b_00;
  VariableType *this_00;
  bool *pbVar3;
  float a_01;
  float b_01;
  EvaluateGreaterOrEqual local_3d;
  int local_3c;
  EvaluateGreaterOrEqual local_35;
  int compNdx_1;
  RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *pRStack_30;
  int compNdx;
  RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *this_local;
  ExecConstValueAccess a_local;
  ExecValueAccess dst_local;
  
  a_local.m_value = (Scalar *)dst.super_ConstStridedValueAccess<64>.m_type;
  a_local.m_type = (VariableType *)a.m_value;
  this_local = (RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *)
               a.m_type;
  pRStack_30 = this;
  this_00 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&this_local);
  TVar2 = VariableType::getBaseType(this_00);
  if (TVar2 == TYPE_FLOAT) {
    for (compNdx_1 = 0; compNdx_1 < 0x40; compNdx_1 = compNdx_1 + 1) {
      a_01 = ConstStridedValueAccess<64>::asFloat
                       ((ConstStridedValueAccess<64> *)&this_local,compNdx_1);
      b_01 = ConstStridedValueAccess<64>::asFloat(&b,compNdx_1);
      bVar1 = EvaluateGreaterOrEqual::operator()(&local_35,a_01,b_01);
      pbVar3 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)&a_local.m_value,compNdx_1);
      *pbVar3 = bVar1;
    }
  }
  else if (TVar2 == TYPE_INT) {
    for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
      a_00 = ConstStridedValueAccess<64>::asInt((ConstStridedValueAccess<64> *)&this_local,local_3c)
      ;
      b_00 = ConstStridedValueAccess<64>::asInt(&b,local_3c);
      bVar1 = EvaluateGreaterOrEqual::operator()(&local_3d,a_00,b_00);
      pbVar3 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)&a_local.m_value,local_3c);
      *pbVar3 = bVar1;
    }
  }
  return;
}

Assistant:

void RelationalOp<ComputeValueRange, EvaluateComp>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());
	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				dst.asBool(compNdx) = EvaluateComp()(a.asFloat(compNdx), b.asFloat(compNdx));
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				dst.asBool(compNdx) = EvaluateComp()(a.asInt(compNdx), b.asInt(compNdx));
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}